

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O2

int pztopology::TPZTetrahedron::SideDimension(int side)

{
  int iVar1;
  ostream *poVar2;
  
  if ((uint)side < 0xf) {
    iVar1 = *(int *)(sidedimension + (ulong)(uint)side * 4);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"TPZTetrahedron::SideDimension side ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPZTetrahedron::SideDimension(int side) {
		if(side<0 || side >= NSides) {
			PZError << "TPZTetrahedron::SideDimension side " << side << endl;
			return -1;
		}
		return sidedimension[side];
	}